

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

void __thiscall
duckdb::StandardBufferManager::VerifyZeroReaders
          (StandardBufferManager *this,BlockLock *lock,shared_ptr<duckdb::BlockHandle,_true> *handle
          )

{
  return;
}

Assistant:

void StandardBufferManager::VerifyZeroReaders(BlockLock &lock, shared_ptr<BlockHandle> &handle) {
#ifdef DUCKDB_DEBUG_DESTROY_BLOCKS
	unique_ptr<FileBuffer> replacement_buffer;
	auto &allocator = Allocator::Get(db);
	auto block_header_size = handle->block_manager.GetBlockHeaderSize();
	auto alloc_size = handle->GetMemoryUsage() - block_header_size;
	auto &buffer = handle->GetBuffer(lock);
	if (handle->GetBufferType() == FileBufferType::BLOCK) {
		auto block = reinterpret_cast<Block *>(buffer.get());
		replacement_buffer = make_uniq<Block>(allocator, block->id, alloc_size, block_header_size);
	} else {
		replacement_buffer = make_uniq<FileBuffer>(allocator, buffer->GetBufferType(), alloc_size, block_header_size);
	}
	memcpy(replacement_buffer->buffer, buffer->buffer, buffer->size);
	WriteGarbageIntoBuffer(lock, *handle);
	buffer = std::move(replacement_buffer);
#endif
}